

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O1

void __thiscall Block::Block(Block *this,uint32_t bIndexIn,string *bDataIn,string *merkroot)

{
  pointer pcVar1;
  time_t tVar2;
  
  (this->bPrevHash)._M_dataplus._M_p = (pointer)&(this->bPrevHash).field_2;
  (this->bPrevHash)._M_string_length = 0;
  (this->bPrevHash).field_2._M_local_buf[0] = '\0';
  (this->_bHash)._M_dataplus._M_p = (pointer)&(this->_bHash).field_2;
  (this->_bHash)._M_string_length = 0;
  (this->_bHash).field_2._M_local_buf[0] = '\0';
  (this->merkle_root)._M_dataplus._M_p = (pointer)&(this->merkle_root).field_2;
  (this->merkle_root)._M_string_length = 0;
  (this->merkle_root).field_2._M_local_buf[0] = '\0';
  (this->_bData)._M_dataplus._M_p = (pointer)&(this->_bData).field_2;
  pcVar1 = (bDataIn->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_bData,pcVar1,pcVar1 + bDataIn->_M_string_length);
  this->_bIndex = bIndexIn;
  std::__cxx11::string::_M_assign((string *)&this->merkle_root);
  this->_bNonce = -1;
  tVar2 = time((time_t *)0x0);
  this->_cTime = tVar2;
  return;
}

Assistant:

Block::Block(uint32_t bIndexIn,const string & bDataIn, string merkroot):_bIndex(bIndexIn),_bData(bDataIn){
    merkle_root = merkroot;
	_bNonce = -1;
	_cTime = time(nullptr);
}